

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol.cc
# Opt level: O2

void __thiscall rcdiscover::WOL::sendImpl(WOL *this,array<unsigned_char,_4UL> *password)

{
  pointer this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sendbuf;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> sockets;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> local_48;
  
  SocketLinux::createAndBindForAllInterfaces(&local_48,this->port_);
  for (this_00 = local_48.
                 super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      local_48.super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    appendMagicPacket(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                      password);
    SocketLinux::enableBroadcastImpl(this_00);
    SocketLinux::enableNonBlockingImpl(this_00);
    SocketLinux::sendImpl
              (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  }
  std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::~vector(&local_48)
  ;
  return;
}

Assistant:

void WOL::sendImpl(const std::array<uint8_t, 4> *password) const
{
  auto sockets = SocketType::createAndBindForAllInterfaces(port_);

  for (auto &socket : sockets)
  {
    std::vector<uint8_t> sendbuf;
    appendMagicPacket(sendbuf, password);

    socket.enableBroadcast();
    socket.enableNonBlocking();

    try
    {
      socket.send(sendbuf);
    }
    catch(const NetworkUnreachableException &)
    {
      continue;
    }
  }
}